

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::remove_handler(Fl_Event_Handler ha)

{
  bool bVar1;
  handler_link *local_20;
  handler_link *p;
  handler_link *l;
  Fl_Event_Handler ha_local;
  
  p = handlers;
  local_20 = (handler_link *)0x0;
  while( true ) {
    bVar1 = false;
    if (p != (handler_link *)0x0) {
      bVar1 = p->handle != ha;
    }
    if (!bVar1) break;
    local_20 = p;
    p = p->next;
  }
  if (p != (handler_link *)0x0) {
    if (local_20 == (handler_link *)0x0) {
      handlers = p->next;
    }
    else {
      local_20->next = p->next;
    }
    if (p != (handler_link *)0x0) {
      operator_delete(p,0x10);
    }
  }
  return;
}

Assistant:

void Fl::remove_handler(Fl_Event_Handler ha) {
  handler_link *l, *p;

  // Search for the handler in the list...
  for (l = handlers, p = 0; l && l->handle != ha; p = l, l = l->next) {/*empty*/}

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else handlers = l->next;

    // And free the record...
    delete l;
  }
}